

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  char *pcVar1;
  AssertionResult *pAVar2;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  extraout_RDX_00;
  bool bVar3;
  AssertionResult AVar4;
  char *begin_string_quote;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  pcVar1 = *needle;
  __haystack = *haystack;
  local_50 = haystack_expr;
  local_48 = needle_expr;
  if (pcVar1 == (char *)0x0 || __haystack == (char *)0x0) {
    bVar3 = pcVar1 == __haystack;
  }
  else {
    pcVar1 = strstr(__haystack,pcVar1);
    bVar3 = pcVar1 != (char *)0x0;
    needle_expr = (char *)extraout_RDX.
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
  }
  if (bVar3 == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_58 = "\"";
    local_38.success_ = false;
    local_38.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pAVar2 = AssertionResult::operator<<(&local_38,(char (*) [11])"Value of: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x22d4ee);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x22a605);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
    pAVar2 = AssertionResult::operator<<(pAVar2,needle);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x22d8e3);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x22cda3);
    local_40 = "not ";
    if (expected_to_be_substring) {
      local_40 = "";
    }
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"a substring of ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x22d4ee);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x22cd7b);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
    pAVar2 = AssertionResult::operator<<(pAVar2,haystack);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x22d8f9);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_38.message_);
    needle_expr = (char *)extraout_RDX_00.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
  }
  AVar4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )needle_expr;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(bool expected_to_be_substring,
                                const char* needle_expr,
                                const char* haystack_expr,
                                const StringType& needle,
                                const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
         << "Value of: " << needle_expr << "\n"
         << "  Actual: " << begin_string_quote << needle << "\"\n"
         << "Expected: " << (expected_to_be_substring ? "" : "not ")
         << "a substring of " << haystack_expr << "\n"
         << "Which is: " << begin_string_quote << haystack << "\"";
}